

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::~Element(Element *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  ElementMeta *this_00;
  pointer ppVar3;
  EventListener *pEVar4;
  TransformState *pTVar5;
  pointer ppEVar6;
  pointer pcVar7;
  code *pcVar8;
  long lVar9;
  bool bVar10;
  uint uVar11;
  Element *pEVar12;
  EventListener **ppEVar13;
  pointer puVar14;
  
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__Element_00335598;
  if (this->parent != (Element *)0x0) {
    bVar10 = Assert("RMLUI_ASSERT(parent == nullptr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                    ,0x7a);
    if (!bVar10) goto LAB_002175c5;
  }
  PluginRegistry::NotifyElementDestroy(this);
  puVar2 = (this->children).
           super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar14 = (this->children).
                 super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar2; puVar14 = puVar14 + 1
      ) {
    pEVar12 = (puVar14->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t
              .super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
              super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    if (pEVar12 != (Element *)0x0) {
      uVar11 = 0;
      do {
        (*(pEVar12->super_ScriptInterface).super_Releasable._vptr_Releasable[0x14])(pEVar12);
        if (1 < uVar11) break;
        uVar11 = uVar11 + 1;
        pEVar12 = pEVar12->parent;
      } while (pEVar12 != (Element *)0x0);
    }
    SetParent((puVar14->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t
              .super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
              super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,(Element *)0x0);
  }
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::_M_erase_at_end(&this->children,
                    (this->children).
                    super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->num_non_dom_children = 0;
  if (DAT_003417a0 == 0) {
    bVar10 = Assert("Resource used before it was initialized, or after it was shut down.",
                    "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                    ,0x46);
    if (!bVar10) goto LAB_002175c5;
  }
  lVar9 = DAT_003417a0;
  this_00 = this->meta;
  *(int *)(DAT_003417a0 + 0x20) = *(int *)(DAT_003417a0 + 0x20) + -1;
  ElementMeta::~ElementMeta(this_00);
  ppVar3 = this_00[1].attribute_event_listeners.m_container.
           super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (EventListener *)
           this_00[1].attribute_event_listeners.m_container.
           super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 == (pointer)0x0) {
    ppEVar13 = (EventListener **)(lVar9 + 0x10);
    if (*(ElementMeta **)(lVar9 + 0x10) != this_00) {
      bVar10 = Assert("RMLUI_ASSERT(first_allocated_node == object)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Pool.inl"
                      ,0xa5);
      if (!bVar10) {
LAB_002175c5:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
    }
  }
  else {
    ppEVar13 = &ppVar3[0x2a].second;
  }
  *ppEVar13 = pEVar4;
  if (pEVar4 != (EventListener *)0x0) {
    pEVar4[0x2a]._vptr_EventListener = (_func_int **)ppVar3;
  }
  ppVar3 = *(pointer *)(lVar9 + 0x18);
  this_00[1].attribute_event_listeners.m_container.
  super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00[1].attribute_event_listeners.m_container.
  super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
  *(ElementMeta **)(lVar9 + 0x18) = this_00;
  ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::~vector
            (&this->animations);
  pTVar5 = (this->transform_state)._M_t.
           super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
           _M_t.
           super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>.
           super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
  if (pTVar5 != (TransformState *)0x0) {
    operator_delete(pTVar5,0xc4);
  }
  (this->transform_state)._M_t.
  super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>._M_t.
  super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>.
  super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl = (TransformState *)0x0;
  ppEVar6 = (this->stacking_context).
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar6 != (pointer)0x0) {
    operator_delete(ppEVar6,(long)(this->stacking_context).
                                  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar6
                   );
  }
  ::std::vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::~vector
            (&this->additional_boxes);
  Box::~Box(&this->main_box);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&(this->attributes).m_container);
  pcVar7 = (this->id)._M_dataplus._M_p;
  paVar1 = &(this->id).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar7 != paVar1) {
    operator_delete(pcVar7,paVar1->_M_allocated_capacity + 1);
  }
  pcVar7 = (this->tag)._M_dataplus._M_p;
  paVar1 = &(this->tag).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar7 != paVar1) {
    operator_delete(pcVar7,paVar1->_M_allocated_capacity + 1);
  }
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::~vector(&this->children);
  EnableObserverPtr<Rml::Element>::~EnableObserverPtr(&this->super_EnableObserverPtr<Rml::Element>);
  return;
}

Assistant:

Element::~Element()
{
	RMLUI_ASSERT(parent == nullptr);

	PluginRegistry::NotifyElementDestroy(this);

	// A simplified version of RemoveChild() for destruction.
	for (ElementPtr& child : children)
	{
		Element* child_ancestor = child.get();
		for (int i = 0; i <= ChildNotifyLevels && child_ancestor; i++, child_ancestor = child_ancestor->GetParentNode())
			child_ancestor->OnChildRemove(child.get());

		child->SetParent(nullptr);
	}

	children.clear();
	num_non_dom_children = 0;

	ElementMetaPool::element_meta_pool->pool.DestroyAndDeallocate(meta);
}